

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<std::optional<char>const&>::operator!=
          (result *__return_storage_ptr__,expression_lhs<std::optional<char>const&> *this,
          optional<long> *rhs)

{
  lest *this_00;
  __optional_ne_t<char,_long> _Var1;
  optional<long> *in_R8;
  allocator<char> local_69;
  string local_68;
  string local_48 [32];
  
  _Var1 = std::operator!=(*(optional<char> **)this,rhs);
  this_00 = *(lest **)this;
  std::__cxx11::string::string<std::allocator<char>>(local_48,"!=",&local_69);
  to_string<std::optional<char>,std::optional<long>>
            (&local_68,this_00,(optional<char> *)local_48,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = _Var1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_68)
  ;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }